

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_anchor(yaml_parser_t *parser,yaml_token_t *token,yaml_token_type_t type)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  yaml_char_t *pyVar4;
  size_t sVar5;
  size_t sVar6;
  yaml_mark_t context_mark;
  int iVar7;
  yaml_char_t *pyVar8;
  char *context;
  bool bVar9;
  int local_7c;
  int local_78;
  int local_74;
  yaml_char_t *local_70;
  yaml_string_t string;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  int length;
  yaml_token_type_t type_local;
  yaml_token_t *token_local;
  yaml_parser_t *parser_local;
  
  start_mark.column._0_4_ = 0;
  memset(&local_70,0,0x18);
  local_70 = (yaml_char_t *)yaml_malloc(0x10);
  if (local_70 == (yaml_char_t *)0x0) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    string.start = local_70 + 0x10;
    string.end = local_70;
    memset(local_70,0,0x10);
    sVar1 = (parser->mark).index;
    sVar2 = (parser->mark).line;
    sVar3 = (parser->mark).column;
    context_mark = parser->mark;
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = (parser->mark).column + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_74 = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_78 = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_7c = 3;
        }
        else {
          local_7c = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_7c = 4;
          }
        }
        local_78 = local_7c;
      }
      local_74 = local_78;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_74;
    if ((parser->unread != 0) || (iVar7 = yaml_parser_update_buffer(parser,1), iVar7 != 0)) {
      while( true ) {
        if ((((*(parser->buffer).pointer < 0x30) || (bVar9 = true, 0x39 < *(parser->buffer).pointer)
             ) && (((*(parser->buffer).pointer < 0x41 ||
                    (bVar9 = true, 0x5a < *(parser->buffer).pointer)) &&
                   ((*(parser->buffer).pointer < 0x61 ||
                    (bVar9 = true, 0x7a < *(parser->buffer).pointer)))))) &&
           (bVar9 = true, *(parser->buffer).pointer != '_')) {
          bVar9 = *(parser->buffer).pointer == '-';
        }
        if (!bVar9) break;
        if ((string.start <= string.end + 5) &&
           (iVar7 = yaml_string_extend(&local_70,&string.end,&string.start), iVar7 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_001b6be9;
        }
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          *string.end = *pyVar4;
          string.end = string.end + 1;
        }
        else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          pyVar8 = string.end + 1;
          *string.end = *pyVar4;
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          string.end = string.end + 2;
          *pyVar8 = *pyVar4;
        }
        else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          *string.end = *pyVar4;
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          pyVar8 = string.end + 2;
          string.end[1] = *pyVar4;
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          string.end = string.end + 3;
          *pyVar8 = *pyVar4;
        }
        else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          *string.end = *pyVar4;
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          string.end[1] = *pyVar4;
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          pyVar8 = string.end + 3;
          string.end[2] = *pyVar4;
          pyVar4 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar4 + 1;
          string.end = string.end + 4;
          *pyVar8 = *pyVar4;
        }
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = (parser->mark).column + 1;
        parser->unread = parser->unread - 1;
        if ((parser->unread == 0) && (iVar7 = yaml_parser_update_buffer(parser,1), iVar7 == 0))
        goto LAB_001b6be9;
        start_mark.column._0_4_ = (int)start_mark.column + 1;
      }
      string.pointer = (yaml_char_t *)(parser->mark).index;
      sVar5 = (parser->mark).line;
      sVar6 = (parser->mark).column;
      if (((int)start_mark.column != 0) &&
         ((((((*(parser->buffer).pointer == ' ' || (*(parser->buffer).pointer == '\t')) ||
             (*(parser->buffer).pointer == '\r')) || (*(parser->buffer).pointer == '\n')) ||
           (((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)) ||
            ((*(parser->buffer).pointer == 0xe2 &&
             (((parser->buffer).pointer[1] == 0x80 && ((parser->buffer).pointer[2] == 0xa8))))))))
          || (((*(parser->buffer).pointer == 0xe2 &&
               (((parser->buffer).pointer[1] == 0x80 && ((parser->buffer).pointer[2] == 0xa9)))) ||
              ((((*(parser->buffer).pointer == '\0' ||
                 (((*(parser->buffer).pointer == '?' || (*(parser->buffer).pointer == ':')) ||
                  (*(parser->buffer).pointer == ',')))) ||
                (((*(parser->buffer).pointer == ']' || (*(parser->buffer).pointer == '}')) ||
                 (*(parser->buffer).pointer == '%')))) ||
               ((*(parser->buffer).pointer == '@' || (*(parser->buffer).pointer == '`')))))))))) {
        if (type == YAML_ANCHOR_TOKEN) {
          memset(token,0,0x50);
          token->type = YAML_ANCHOR_TOKEN;
          (token->start_mark).index = sVar1;
          (token->start_mark).line = sVar2;
          (token->start_mark).column = sVar3;
          (token->end_mark).index = (size_t)string.pointer;
          (token->end_mark).line = sVar5;
          (token->end_mark).column = sVar6;
          (token->data).tag.handle = local_70;
        }
        else {
          memset(token,0,0x50);
          token->type = YAML_ALIAS_TOKEN;
          (token->start_mark).index = sVar1;
          (token->start_mark).line = sVar2;
          (token->start_mark).column = sVar3;
          (token->end_mark).index = (size_t)string.pointer;
          (token->end_mark).line = sVar5;
          (token->end_mark).column = sVar6;
          (token->data).tag.handle = local_70;
        }
        return 1;
      }
      context = "while scanning an alias";
      if (type == YAML_ANCHOR_TOKEN) {
        context = "while scanning an anchor";
      }
      yaml_parser_set_scanner_error
                (parser,context,context_mark,"did not find expected alphabetic or numeric character"
                );
    }
  }
LAB_001b6be9:
  yaml_free(local_70);
  return 0;
}

Assistant:

static int
yaml_parser_scan_anchor(yaml_parser_t *parser, yaml_token_t *token,
        yaml_token_type_t type)
{
    int length = 0;
    yaml_mark_t start_mark, end_mark;
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Eat the indicator character. */

    start_mark = parser->mark;

    SKIP(parser);

    /* Consume the value. */

    if (!CACHE(parser, 1)) goto error;

    while (IS_ALPHA(parser->buffer)) {
        if (!READ(parser, string)) goto error;
        if (!CACHE(parser, 1)) goto error;
        length ++;
    }

    end_mark = parser->mark;

    /*
     * Check if length of the anchor is greater than 0 and it is followed by
     * a whitespace character or one of the indicators:
     *
     *      '?', ':', ',', ']', '}', '%', '@', '`'.
     */

    if (!length || !(IS_BLANKZ(parser->buffer) || CHECK(parser->buffer, '?')
                || CHECK(parser->buffer, ':') || CHECK(parser->buffer, ',')
                || CHECK(parser->buffer, ']') || CHECK(parser->buffer, '}')
                || CHECK(parser->buffer, '%') || CHECK(parser->buffer, '@')
                || CHECK(parser->buffer, '`'))) {
        yaml_parser_set_scanner_error(parser, type == YAML_ANCHOR_TOKEN ?
                "while scanning an anchor" : "while scanning an alias", start_mark,
                "did not find expected alphabetic or numeric character");
        goto error;
    }

    /* Create a token. */

    if (type == YAML_ANCHOR_TOKEN) {
        ANCHOR_TOKEN_INIT(*token, string.start, start_mark, end_mark);
    }
    else {
        ALIAS_TOKEN_INIT(*token, string.start, start_mark, end_mark);
    }

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}